

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O1

void __thiscall Fl_Window::_Fl_Window(Fl_Window *this)

{
  Fl_Image *pFVar1;
  icon_data *piVar2;
  
  (this->super_Fl_Group).super_Fl_Widget.type_ = 0xf0;
  (this->super_Fl_Group).super_Fl_Widget.box_ = '\x01';
  pFVar1 = Fl::scheme_bg_;
  if (Fl::scheme_bg_ == (Fl_Image *)0x0) {
    (this->super_Fl_Group).super_Fl_Widget.label_.type = '\x01';
  }
  else {
    (this->super_Fl_Group).super_Fl_Widget.label_.type = '\0';
    (this->super_Fl_Group).super_Fl_Widget.label_.align_ = 0x50;
    (this->super_Fl_Group).super_Fl_Widget.label_.image = pFVar1;
  }
  this->i = (Fl_X *)0x0;
  this->xclass_ = (char *)0x0;
  piVar2 = (icon_data *)operator_new(0x18);
  this->icon_ = piVar2;
  *(undefined8 *)piVar2 = 0;
  *(undefined8 *)(piVar2 + 8) = 0;
  *(undefined8 *)(piVar2 + 0x10) = 0;
  this->iconlabel_ = (char *)0x0;
  (this->super_Fl_Group).resizable_ = (Fl_Widget *)0x0;
  this->size_range_set = '\0';
  this->minw = 0;
  this->minh = 0;
  this->maxw = 0;
  this->maxh = 0;
  shape_data_ = (shape_data_type *)0x0;
  (this->super_Fl_Group).super_Fl_Widget.callback_ = default_callback;
  return;
}

Assistant:

void Fl_Window::_Fl_Window() {
  type(FL_WINDOW);
  box(FL_FLAT_BOX);
  if (Fl::scheme_bg_) {
    labeltype(FL_NORMAL_LABEL);
    align(FL_ALIGN_CENTER | FL_ALIGN_INSIDE | FL_ALIGN_CLIP);
    image(Fl::scheme_bg_);
  } else {
    labeltype(FL_NO_LABEL);
  }
  i = 0;
  xclass_ = 0;
  icon_ = new icon_data;
  memset(icon_, 0, sizeof(*icon_));
  iconlabel_ = 0;
  resizable(0);
  size_range_set = 0;
  minw = maxw = minh = maxh = 0;
  shape_data_ = NULL;

#if FLTK_ABI_VERSION >= 10301
  no_fullscreen_x = 0;
  no_fullscreen_y = 0;
  no_fullscreen_w = w();
  no_fullscreen_h = h();
#endif

#if FLTK_ABI_VERSION >= 10303
  fullscreen_screen_top = -1;
  fullscreen_screen_bottom = -1;
  fullscreen_screen_left = -1;
  fullscreen_screen_right = -1;
#endif

  callback((Fl_Callback*)default_callback);
}